

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testchar.c
# Opt level: O1

int testDocumentRangeByte2(xmlParserCtxtPtr ctxt,char *document,int len,char *data)

{
  long lVar1;
  uint uVar2;
  char *__format;
  uint uVar3;
  ulong uVar4;
  uint local_34;
  
  uVar2 = 0x80;
  do {
    local_34 = uVar2 & 0xe0;
    uVar4 = 0;
    do {
      lastError = 0;
      xmlCtxtReset(ctxt);
      *data = (char)uVar2;
      data[1] = (char)uVar4;
      lVar1 = xmlReadMemory(document,len,"test",0,0);
      if ((((uVar2 & 0x40) == 0) || (((uint)uVar4 & 0xc0) != 0x80)) || ((uVar2 & 0x1e) == 0)) {
        if ((lastError == 0) || (lVar1 != 0)) {
          __format = "Failed to detect invalid char for Bytes 0x%02X 0x%02X\n";
          goto LAB_00103861;
        }
      }
      else if (local_34 == 0xe0) {
        if ((lastError == 0) || (lVar1 != 0)) {
          __format = "Failed to detect invalid char for Bytes 0x%02X 0x%02X 0x00\n";
LAB_00103861:
          fprintf(_stderr,__format,(ulong)uVar2,uVar4);
          return 1;
        }
      }
      else if ((lastError != 0) || (lVar1 == 0)) {
        __format = "Failed to parse document for Bytes 0x%02X 0x%02X\n";
        goto LAB_00103861;
      }
      if (lVar1 != 0) {
        xmlFreeDoc(lVar1);
      }
      uVar3 = (uint)uVar4 + 1;
      uVar4 = (ulong)uVar3;
    } while (uVar3 != 0x100);
    uVar2 = uVar2 + 1;
    if (uVar2 == 0x100) {
      return 0;
    }
  } while( true );
}

Assistant:

static int testDocumentRangeByte2(xmlParserCtxtPtr ctxt, char *document,
                  int len,  char *data) {
    int i, j;
    xmlDocPtr res;

    for (i = 0x80;i <= 0xFF;i++) {
    for (j = 0;j <= 0xFF;j++) {
	lastError = 0;
	xmlCtxtReset(ctxt);

        data[0] = (char) i;
        data[1] = (char) j;

	res = xmlReadMemory(document, len, "test", NULL, 0);

	/* if first bit of first char is set, then second bit must too */
	if ((i & 0x80) && ((i & 0x40) == 0)) {
	    if ((lastError == 0) || (res != NULL)) {
		fprintf(stderr,
		"Failed to detect invalid char for Bytes 0x%02X 0x%02X\n",
			i, j);
		return(1);
	    }
	}

	/*
	 * if first bit of first char is set, then second char first
	 * bits must be 10
	 */
	else if ((i & 0x80) && ((j & 0xC0) != 0x80)) {
	    if ((lastError == 0) || (res != NULL)) {
		fprintf(stderr,
	    "Failed to detect invalid char for Bytes 0x%02X 0x%02X\n",
			i, j);
		return(1);
	    }
	}

	/*
	 * if using a 2 byte encoding then the value must be greater
	 * than 0x80, i.e. one of bits 5 to 1 of i must be set
	 */
	else if ((i & 0x80) && ((i & 0x1E) == 0)) {
	    if ((lastError == 0) || (res != NULL)) {
		fprintf(stderr,
	    "Failed to detect invalid char for Bytes 0x%02X 0x%02X\n",
			i, j);
		return(1);
	    }
	}

	/*
	 * if third bit of first char is set, then the sequence would need
	 * at least 3 bytes, but we give only 2 !
	 */
	else if ((i & 0xE0) == 0xE0) {
	    if ((lastError == 0) || (res != NULL)) {
		fprintf(stderr,
	    "Failed to detect invalid char for Bytes 0x%02X 0x%02X 0x00\n",
			i, j);
		return(1);
	    }
	}

	/*
	 * We should see no error in remaining cases
	 */
	else if ((lastError != 0) || (res == NULL)) {
	    fprintf(stderr,
		"Failed to parse document for Bytes 0x%02X 0x%02X\n", i, j);
	    return(1);
	}
	if (res != NULL)
	    xmlFreeDoc(res);
    }
    }
    return(0);
}